

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O1

void Kumu::hexdump(byte_t *buf,ui32_t dump_len,FILE *stream)

{
  uint uVar1;
  int iVar2;
  byte_t *pbVar3;
  byte_t *pbVar4;
  uint uVar5;
  long lVar6;
  byte_t *pbVar7;
  uint uVar8;
  bool bVar9;
  
  if (buf != (byte_t *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stderr;
    }
    if (dump_len != 0) {
      pbVar4 = buf + dump_len;
      pbVar3 = buf + 1;
      do {
        fprintf((FILE *)stream,"  %06x: ");
        uVar5 = 0xffffffff;
        pbVar7 = pbVar3;
        uVar1 = 0;
        do {
          uVar8 = uVar1;
          uVar5 = uVar5 + 1;
          fprintf((FILE *)stream,"%02x ",(ulong)pbVar7[-1]);
          if (0xe < uVar5) break;
          bVar9 = pbVar7 < pbVar4;
          pbVar7 = pbVar7 + 1;
          uVar1 = uVar8 + 1;
        } while (bVar9);
        while (uVar5 < 0xf) {
          fputs("   ",(FILE *)stream);
          uVar8 = uVar8 + 1;
          uVar5 = uVar8;
        }
        if (buf < pbVar4) {
          lVar6 = 0;
          do {
            uVar5 = (uint)buf[lVar6];
            iVar2 = isprint((uint)buf[lVar6]);
            if (iVar2 == 0) {
              uVar5 = 0x2e;
            }
            fputc(uVar5,(FILE *)stream);
          } while (((uint)lVar6 < 0xf) &&
                  (pbVar7 = pbVar3 + lVar6, lVar6 = lVar6 + 1, pbVar7 < pbVar4));
        }
        fputc(10,(FILE *)stream);
        buf = buf + 0x10;
        pbVar3 = pbVar3 + 0x10;
      } while (buf < pbVar4);
    }
  }
  return;
}

Assistant:

void
Kumu::hexdump(const byte_t* buf, ui32_t dump_len, FILE* stream)
{
  if ( buf == 0 )
    return;

  if ( stream == 0 )
    stream = stderr;

  static ui32_t row_len = 16;
  const byte_t* p = buf;
  const byte_t* end_p = p + dump_len;

  for ( ui32_t line = 0; p < end_p; line++ )
    {
      fprintf(stream, "  %06x: ", line);
      ui32_t i;
      const byte_t* pp;

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fprintf(stream, "%02x ", *pp);

      while ( i++ < row_len )
	fputs("   ", stream);

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fputc((isprint(*pp) ? *pp : '.'), stream);

      fputc('\n', stream);
      p += row_len;
    }
}